

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar1;
  pointer piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  type tVar10;
  size_type sVar11;
  size_type sVar12;
  pointer piVar13;
  int *piVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int i;
  char *pcVar22;
  float fVar23;
  pair<unsigned_long,_unsigned_long> pVar24;
  Settings __tmp;
  size_type expected_buckets;
  TypeParam other_ht;
  hasher hasher;
  KeyInfo __tmp_1;
  pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  local_248;
  ulong uStack_220;
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_218;
  undefined1 local_210 [8];
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_208;
  pointer piStack_200;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_1f8;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pBStack_1f0;
  float local_1e8;
  float fStack_1e4;
  ulong uStack_1e0;
  Hasher local_1d8;
  type tStack_1cc;
  type local_1c8;
  size_type local_1c0;
  size_type sStack_1b8;
  ulong local_1b0;
  pointer local_198;
  undefined1 local_188 [8];
  int *local_180;
  pointer piStack_178;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_170;
  ulong uStack_168;
  float local_160;
  float fStack_15c;
  undefined8 uStack_158;
  Hasher local_150;
  int iStack_144;
  type local_140;
  size_type local_138;
  size_type sStack_130;
  ulong local_128;
  pointer local_110;
  key_equal local_fc;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_e8;
  key_equal local_60;
  hasher local_54 [3];
  
  local_54[0].id_ = 1;
  local_54[0].num_hashes_ = 0;
  local_54[0].num_compares_ = 0;
  local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffff00000000);
  local_180 = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable(&local_e8,200,local_54,local_54,(allocator_type *)local_188);
  iVar17 = UniqueObjectHelper<int>(1);
  local_218 = &(this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(local_218);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x2a)
       = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar17;
  iVar17 = UniqueObjectHelper<int>(2);
  pdVar1 = &local_e8.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(pdVar1);
  local_e8.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar17;
  local_e8.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
  iVar17 = 3;
  do {
    iVar18 = UniqueObjectHelper<int>(iVar17);
    local_210._0_4_ = iVar18;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_188,
             &(this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)local_210);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 2000);
  iVar17 = UniqueObjectHelper<int>(1000);
  local_188._0_4_ = -iVar17;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(local_218,(key_type *)local_188);
  iVar17 = UniqueObjectHelper<int>(0x7d1);
  local_210._0_4_ = iVar17;
  google::
  BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_188,
           &local_e8.
            super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_210);
  local_f0 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_e8.
             super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.num_buckets;
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(local_218,pdVar1);
  iVar17 = UniqueObjectHelper<int>(2);
  local_210._0_4_ = -iVar17;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"this->UniqueKey(2)","this->ht_.deleted_key()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1db,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  iVar17 = UniqueObjectHelper<int>(1);
  local_210._0_4_ = -iVar17;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   local_e8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"this->UniqueKey(1)","other_ht.deleted_key()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1dc,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210._0_4_ = 1;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   (local_218->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","this->ht_.hash_funct().id()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1de,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   local_e8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","other_ht.hash_funct().id()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1df,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210._0_4_ = 1;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","this->ht_.key_eq().id()",(int *)local_210,(int *)&local_248)
  ;
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e1,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   local_e8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","other_ht.key_eq().id()",(int *)local_210,(int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e2,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210 = (undefined1  [8])
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_188,"expected_buckets","this->ht_.bucket_count()",
             (unsigned_long *)&local_f0,(unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e4,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210 = (undefined1  [8])
              local_e8.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_buckets;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,200);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((internal *)local_188,"other_ht.bucket_count()","200u",(unsigned_long *)local_210,
             (uint *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e5,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,1);
  local_210 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.size()",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e7,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,0x7cc);
  local_210 = (undefined1  [8])
              (local_e8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.num_elements -
              local_e8.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1996u","other_ht.size()",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1e8,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_248.first.super_iterator.ht & 0xffffffff00000000);
  iVar17 = UniqueObjectHelper<int>(0x6f);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_218,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ea,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,1);
  iVar17 = UniqueObjectHelper<int>(0x6f);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(pdVar1,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","other_ht.count(this->UniqueKey(111))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1eb,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,1);
  iVar17 = UniqueObjectHelper<int>(0x7d1);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_218,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.count(this->UniqueKey(2001))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ec,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_248.first.super_iterator.ht & 0xffffffff00000000);
  iVar17 = UniqueObjectHelper<int>(0x7d1);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(pdVar1,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(2001))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ed,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_248.first.super_iterator.ht & 0xffffffff00000000);
  iVar17 = UniqueObjectHelper<int>(1000);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_218,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","this->ht_.count(this->UniqueKey(1000))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ee,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_248.first.super_iterator.ht & 0xffffffff00000000);
  iVar17 = UniqueObjectHelper<int>(1000);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(pdVar1,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(1000))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ef,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::swap(local_218,pdVar1);
  iVar17 = UniqueObjectHelper<int>(1);
  local_210._0_4_ = -iVar17;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   (this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"this->UniqueKey(1)","this->ht_.deleted_key()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fc,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  iVar17 = UniqueObjectHelper<int>(2);
  local_210._0_4_ = -iVar17;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   local_e8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.key_info.delkey);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"this->UniqueKey(2)","other_ht.deleted_key()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fd,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   (local_218->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"0","this->ht_.hash_funct().id()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1fe,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_210._0_4_ = 1;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,
                   local_e8.
                   super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                   super_Hasher.id_);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_188,"1","other_ht.hash_funct().id()",(int *)local_210,
             (int *)&local_248);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x1ff,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,0x7cc);
  local_210 = (undefined1  [8])
              ((this->
               super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.num_elements -
              (this->
              super_HashtableAllTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ).
              super_HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1996u","this->ht_.size()",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x200,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,1);
  local_210 = (undefined1  [8])
              (local_e8.
               super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.num_elements -
              local_e8.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","other_ht.size()",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x201,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_248.first.super_iterator.ht._4_4_,1);
  iVar17 = UniqueObjectHelper<int>(0x6f);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(local_218,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"1u","this->ht_.count(this->UniqueKey(111))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x202,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_248.first.super_iterator.ht & 0xffffffff00000000);
  iVar17 = UniqueObjectHelper<int>(0x6f);
  local_fc.id_ = -iVar17;
  pVar24 = google::
           dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(pdVar1,&local_fc.id_);
  local_210._1_7_ = 0;
  local_210[0] = pVar24.first != 0xffffffffffffffff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_188,"0u","other_ht.count(this->UniqueKey(111))",(uint *)&local_248,
             (unsigned_long *)local_210);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if (local_180 == (int *)0x0) {
      pcVar22 = "";
    }
    else {
      pcVar22 = *(char **)local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x203,pcVar22);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if (local_210 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_210 + 8))();
    }
  }
  piVar14 = local_180;
  if (local_180 != (int *)0x0) {
    if (*(int **)local_180 != local_180 + 4) {
      operator_delete(*(int **)local_180);
    }
    operator_delete(piVar14);
  }
  local_248.first.super_iterator.ht._0_4_ = 0;
  local_248.first.super_iterator.ht._4_4_ = 0;
  local_248.first.super_iterator.pos =
       (pointer)((ulong)local_248.first.super_iterator.pos._4_4_ << 0x20);
  local_fc.id_ = 0;
  local_fc.num_hashes_ = 0;
  local_fc.num_compares_ = 0;
  local_210 = (undefined1  [8])((ulong)local_210 & 0xffffffff00000000);
  local_208 = (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_188,0,(hasher *)&local_248,&local_fc,(allocator_type *)local_210);
  iVar17 = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180);
  uStack_158._0_3_ = CONCAT12(true,(undefined2)uStack_158);
  iStack_144 = -iVar17;
  iVar17 = 2;
  do {
    local_248.first.super_iterator.ht._0_4_ = UniqueObjectHelper<int>(iVar17);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_210,
             (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_188,(value_type *)&local_248);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 10000);
  local_fc.id_ = 0;
  local_fc.num_hashes_ = 0;
  local_fc.num_compares_ = 0;
  local_60.id_ = 0;
  local_60.num_hashes_ = 0;
  local_60.num_compares_ = 0;
  local_248.first.super_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_248.first.super_iterator.ht._4_4_ << 0x20);
  local_248.first.super_iterator.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_210,0,&local_fc,&local_60,(allocator_type *)&local_248);
  uVar21 = local_128;
  uVar15 = _local_160;
  piVar13 = local_198;
  uVar19 = local_1b0;
  sVar12 = sStack_1b8;
  sVar11 = local_1c0;
  tVar10 = local_1c8;
  uVar8 = stack0xfffffffffffffe30;
  uVar6 = local_1d8._0_8_;
  uVar5 = uStack_1e0;
  uVar3 = _local_1e8;
  piVar2 = piStack_200;
  pdVar1 = local_208;
  local_248._32_8_ = _local_1e8;
  uStack_220 = uStack_1e0;
  local_248.first.super_iterator.end = (pointer)local_1f8;
  local_248.first.parent_ = pBStack_1f0;
  local_248.first.super_iterator.ht = local_208;
  local_248.first.super_iterator.pos = piStack_200;
  local_1e8 = local_160;
  fStack_1e4 = fStack_15c;
  uVar4 = _local_1e8;
  local_208 = (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_180;
  piStack_200 = piStack_178;
  local_1e8 = (float)uVar3;
  fStack_1e4 = SUB84(uVar3,4);
  local_160 = local_1e8;
  fStack_15c = fStack_1e4;
  uVar16 = _local_160;
  local_180 = (int *)pdVar1;
  piStack_178 = piVar2;
  local_1c8 = local_140;
  local_1d8.id_ = local_150.id_;
  local_1d8.num_hashes_ = local_150.num_hashes_;
  uVar7 = local_1d8._0_8_;
  local_1d8.num_compares_ = local_150.num_compares_;
  tStack_1cc = iStack_144;
  uVar9 = stack0xfffffffffffffe30;
  local_140 = tVar10;
  local_1d8.id_ = (int)uVar6;
  local_1d8.num_hashes_ = SUB84(uVar6,4);
  local_150.id_ = local_1d8.id_;
  local_150.num_hashes_ = local_1d8.num_hashes_;
  local_1d8.num_compares_ = (int)uVar8;
  tStack_1cc = SUB84(uVar8,4);
  local_150.num_compares_ = local_1d8.num_compares_;
  iStack_144 = tStack_1cc;
  local_1c0 = local_138;
  sStack_1b8 = sStack_130;
  local_138 = sVar11;
  sStack_130 = sVar12;
  local_1b0 = local_128;
  local_128 = uVar19;
  local_198 = local_110;
  local_110 = piVar13;
  local_1e8 = (float)uVar15;
  local_1e8 = local_1e8 * (float)uVar21;
  uVar20 = (ulong)local_1e8;
  local_1f8 = (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)((long)(local_1e8 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20);
  fStack_1e4 = SUB84(uVar15,4);
  fStack_1e4 = (float)uVar21 * fStack_1e4;
  uVar21 = (ulong)fStack_1e4;
  pBStack_1f0 = (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 *)((long)(fStack_1e4 - 9.223372e+18) & (long)uVar21 >> 0x3f | uVar21);
  uStack_1e0 = uStack_158 & 0xffffffffffffff00;
  fVar23 = (float)uVar19;
  local_160 = (float)uVar3;
  local_160 = local_160 * fVar23;
  uVar19 = (ulong)local_160;
  local_170 = (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)((long)(local_160 - 9.223372e+18) & (long)uVar19 >> 0x3f | uVar19);
  fStack_15c = SUB84(uVar3,4);
  fVar23 = fVar23 * fStack_15c;
  uStack_168 = (ulong)fVar23;
  uStack_168 = (long)(fVar23 - 9.223372e+18) & (long)uStack_168 >> 0x3f | uStack_168;
  uStack_158 = uVar5 & 0xffffffffffffff00;
  _local_1e8 = uVar4;
  local_1d8._0_8_ = uVar7;
  unique0x10002751 = uVar9;
  _local_160 = uVar16;
  iVar17 = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)&local_180);
  uStack_158._2_1_ = true;
  iStack_144 = -iVar17;
  iVar17 = 2;
  do {
    iVar18 = UniqueObjectHelper<int>(iVar17);
    local_fc.id_ = iVar18;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(&local_248,
             (BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)local_188,&local_fc.id_);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 10000);
  local_210 = (undefined1  [8])&PTR__BaseHashtableInterface_00c16888;
  if (local_198 != (pointer)0x0) {
    free(local_198);
  }
  local_188 = (undefined1  [8])&PTR__BaseHashtableInterface_00c16888;
  if (local_110 != (pointer)0x0) {
    free(local_110);
  }
  local_e8.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c16888;
  if (local_e8.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_e8.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}